

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cpp
# Opt level: O1

bool __thiscall InterCode::doArith(InterCode *this)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  undefined1 local_60 [8];
  _Alloc_hider local_58;
  char local_48 [16];
  int local_38;
  
  iVar1 = this->kind;
  iVar4 = 0;
  if (3 < iVar1 - 1U) {
    return false;
  }
  uVar2 = (this->arg1).kind;
  if (uVar2 == 2) {
    iVar4 = atoi((this->arg1).value._M_dataplus._M_p);
  }
  uVar3 = (this->arg2).kind;
  iVar5 = 0;
  if (uVar3 == 2) {
    iVar5 = atoi((this->arg2).value._M_dataplus._M_p);
  }
  if (iVar1 != 2 || uVar3 != 0) {
    if ((uVar2 ^ 2) != 0 || (uVar3 ^ 2) != 0) {
      if (uVar2 != 2 && uVar3 != 2) {
        return false;
      }
      if ((uVar2 ^ 2) == 0 && iVar4 == 0) {
        if (1 < iVar1 - 3U) {
          if (iVar1 != 1) {
            return false;
          }
          this->kind = 5;
          (this->arg1).kind = uVar3;
          std::__cxx11::string::_M_assign((string *)&(this->arg1).value);
          (this->arg1).active = (this->arg2).active;
LAB_001097b1:
          (this->arg2).kind = 0;
          (this->arg2).value._M_string_length = 0;
          *(this->arg2).value._M_dataplus._M_p = '\0';
          return false;
        }
      }
      else {
        if ((uVar3 ^ 2) != 0 || iVar5 != 0) {
          return false;
        }
        if (iVar1 - 1U < 2) {
          this->kind = 5;
          goto LAB_001097b1;
        }
        if (iVar1 != 3) {
          return false;
        }
      }
      this->kind = 5;
      (this->arg2).kind = 0;
      (this->arg2).value._M_string_length = 0;
      *(this->arg2).value._M_dataplus._M_p = '\0';
      (this->arg1).kind = OP_ZERO.kind;
      std::__cxx11::string::_M_assign((string *)&(this->arg1).value);
      (this->arg1).active = OP_ZERO.active;
      return false;
    }
    if (iVar1 == 3) {
      iVar5 = iVar5 * iVar4;
    }
    else if (iVar1 == 2) {
      iVar5 = iVar4 - iVar5;
    }
    else if (iVar1 == 1) {
      iVar5 = iVar5 + iVar4;
    }
    else {
      iVar5 = iVar4 / iVar5;
    }
    (this->arg2).kind = 0;
    (this->arg2).value._M_string_length = 0;
    *(this->arg2).value._M_dataplus._M_p = '\0';
    Operand::Operand((Operand *)local_60,iVar5);
    (this->arg1).kind = local_60._0_4_;
    std::__cxx11::string::operator=((string *)&(this->arg1).value,(string *)&local_58);
    (this->arg1).active = local_38;
    if (local_58._M_p != local_48) {
      operator_delete(local_58._M_p);
    }
  }
  this->kind = 5;
  return true;
}

Assistant:

bool InterCode::doArith() {
    if (kind >= IC_ADD && kind <= IC_DIV) {
        int a1 = 0, a2 = 0;
        bool isA1 = arg1.getInt(a1), isA2 = arg2.getInt(a2);
        if (arg2.kind == IR_NONE && kind == IC_SUB) {
            a1 = -a1;
            kind = IC_ASSIGN;
            return true;
        }
        else if (isA1 && isA2) {
            switch (kind) {
                case IC_ADD: a1 += a2; break;
                case IC_SUB: a1 -= a2; break;
                case IC_MUL: a1 *= a2; break;
                default:     a1 /= a2;
            }
            arg2.clear();
            arg1 = Operand(a1);
            kind = IC_ASSIGN;
            return true;
        }
        else if (isA1 || isA2) {
            if (isA1 && a1 == 0) {
                if (kind == IC_MUL || kind == IC_DIV) {
                    kind = IC_ASSIGN;
                    arg2.clear();
                    arg1 = OP_ZERO;
                }
                else if (kind == IC_ADD) {
                    kind = IC_ASSIGN;
                    arg1 = arg2;
                    arg2.clear();
                }
            }
            else if (isA2 && a2 == 0) {
                if (kind == IC_MUL) {
                    kind = IC_ASSIGN;
                    arg2.clear();
                    arg1 = OP_ZERO;
                }
                else if (kind == IC_ADD || kind == IC_SUB) {
                    kind = IC_ASSIGN;
                    arg2.clear();
                }
            }
        }
    }
    return false;
}